

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void change_direction_move(Direction *direction,char input_direction)

{
  int iVar1;
  Direction DVar2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  
  DVar2 = LEFT;
  iVar1 = (int)CONCAT71(in_register_00000031,input_direction);
  iVar3 = (int)input_direction;
  switch(iVar1) {
  case 0x41:
switchD_001033f8_caseD_41:
    *direction = UP;
    uVar4 = (ulong)(iVar3 - 0x42U);
    if (0x31 < iVar3 - 0x42U) {
      return;
    }
    if ((0x80000004UL >> (uVar4 & 0x3f) & 1) != 0) goto switchD_001033f8_caseD_44;
    if ((0x400000002U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x2000000000001U >> (uVar4 & 0x3f) & 1) == 0) {
        return;
      }
      goto switchD_001033f8_caseD_42;
    }
    break;
  case 0x42:
switchD_001033f8_caseD_42:
    *direction = DOWN;
    if (iVar3 != 100) {
      if ((iVar3 == 0x44) || (iVar3 == 0x61)) goto switchD_001033f8_caseD_44;
      if (iVar3 != 0x43) {
        return;
      }
    }
    break;
  case 0x43:
    break;
  case 0x44:
    goto switchD_001033f8_caseD_44;
  default:
    if (iVar1 == 0x61) goto switchD_001033f8_caseD_44;
    if (iVar1 != 100) {
      if (iVar1 != 0x73) {
        if (iVar1 != 0x77) {
          return;
        }
        goto switchD_001033f8_caseD_41;
      }
      goto switchD_001033f8_caseD_42;
    }
  }
  DVar2 = RIGHT;
switchD_001033f8_caseD_44:
  *direction = DVar2;
  return;
}

Assistant:

void change_direction_move(Direction& direction, char input_direction)
{
    if(input_direction == KEY_UP or input_direction == 'w')
        direction = UP;

    if(input_direction == KEY_DOWN or input_direction == 's')
        direction = DOWN;

    if(input_direction == KEY_LEFT or input_direction == 'a')
        direction = LEFT;

    if(input_direction == KEY_RIGHT or input_direction == 'd')
        direction = RIGHT;
}